

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O0

int initialize_tcp(string *host,string *port)

{
  FILE *__stream;
  int iVar1;
  int val;
  char *pcVar2;
  char *__service;
  Error *this;
  int sock;
  addrinfo *paStack_50;
  int err;
  addrinfo *addr_result;
  addrinfo addr_hints;
  string *port_local;
  string *host_local;
  
  addr_hints.ai_next = (addrinfo *)port;
  memset(&addr_result,0,0x30);
  addr_result._4_4_ = 2;
  addr_hints.ai_flags = 1;
  addr_hints.ai_family = 6;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)host);
  __service = (char *)std::__cxx11::string::operator[]((ulong)port);
  iVar1 = getaddrinfo(pcVar2,__service,(addrinfo *)&addr_result,&stack0xffffffffffffffb0);
  __stream = _stderr;
  if ((iVar1 != -0xb) && (iVar1 == 0)) {
    iVar1 = socket(paStack_50->ai_family,paStack_50->ai_socktype,paStack_50->ai_protocol);
    no_err(iVar1,"tcp socket");
    val = connect(iVar1,paStack_50->ai_addr,paStack_50->ai_addrlen);
    no_err(val,"tcp connect");
    freeaddrinfo(paStack_50);
    return iVar1;
  }
  pcVar2 = gai_strerror(iVar1);
  fprintf(__stream,"getaddrinfo: %s",pcVar2);
  this = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this,"Failed to create tcp client socket");
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

int initialize_tcp(std::string host, std::string port) {
  struct addrinfo addr_hints;
  struct addrinfo *addr_result;
  memset(&addr_hints, 0, sizeof(struct addrinfo));
  addr_hints.ai_family = AF_INET; // IPv4
  addr_hints.ai_socktype = SOCK_STREAM;
  addr_hints.ai_protocol = IPPROTO_TCP;
  int err = getaddrinfo(&host[0], &port[0], &addr_hints, &addr_result);
  if (err == EAI_SYSTEM || err != 0) {
    fprintf(stderr, "getaddrinfo: %s", gai_strerror(err));
    throw Error("Failed to create tcp client socket");
  }
  int sock;
  no_err(sock = socket(addr_result->ai_family, addr_result->ai_socktype, addr_result->ai_protocol), "tcp socket");
  no_err(connect(sock, addr_result->ai_addr, addr_result->ai_addrlen), "tcp connect");

  freeaddrinfo(addr_result);
  return sock;
}